

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall
helics::LogManager::setLoggingFile(LogManager *this,string_view lfile,string *identifier)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  bool bVar1;
  file_event_handlers *in_RCX;
  size_t in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  file_event_handlers *in_stack_ffffffffffffff00;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff28;
  file_event_handlers *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff4f;
  filename_t *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c1c90);
  if (!bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff00);
    __y._M_str = in_stack_ffffffffffffff20;
    __y._M_len = in_RDI;
    bVar1 = std::operator==(in_stack_ffffffffffffff28,__y);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_005c1dfc;
  }
  std::__cxx11::string::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff00,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef8);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c1d2f);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x58));
    if (bVar1) {
      spdlog::drop((string *)0x5c1dea);
      CLI::std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::reset
                (in_stack_ffffffffffffff10);
    }
  }
  else {
    spdlog::file_event_handlers::file_event_handlers(in_RCX);
    spdlog::basic_logger_mt<spdlog::synchronous_factory>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,
               in_stack_ffffffffffffff40);
    CLI::std::shared_ptr<spdlog::logger>::operator=
              ((shared_ptr<spdlog::logger> *)in_RCX,
               (shared_ptr<spdlog::logger> *)in_stack_fffffffffffffef8);
    CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x5c1da6);
    spdlog::file_event_handlers::~file_event_handlers(in_RCX);
    in_stack_ffffffffffffff00 = in_RCX;
  }
LAB_005c1dfc:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  return;
}

Assistant:

void LogManager::setLoggingFile(std::string_view lfile, const std::string& identifier)
{
    if (logFile.empty() || lfile != logFile) {
        logFile = lfile;
        if (!logFile.empty()) {
            fileLogger = spdlog::basic_logger_mt(identifier, logFile);
        } else {
            if (fileLogger) {
                spdlog::drop(logIdentifier);
                fileLogger.reset();
            }
        }
    }
    logIdentifier = identifier;
}